

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O0

Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readAnyValue_abi_cxx11_
          (Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  YamlEvent *pYVar3;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *sequence;
  Mapping *mapping;
  string local_468;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  Value local_428;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  undefined1 local_398 [8];
  Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_1;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  undefined1 local_2d0 [8];
  Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  undefined1 local_238 [8];
  YamlEvent event;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  undefined1 local_1d0 [8];
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_d0 [8];
  YamlEvent event_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_50 [8];
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result_1;
  State state;
  ParserContext *this_local;
  
  event_result_1._44_4_ = 0;
  do {
    if (event_result_1._44_4_ == 2) {
      getNextEvent_abi_cxx11_
                ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1d0,this);
      bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_1d0);
      if (bVar1) {
        pYVar3 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1d0);
        YamlEvent::YamlEvent((YamlEvent *)local_238,pYVar3);
        if (local_238._0_4_ == YAML_SCALAR_EVENT) {
          Value::Value((Value *)&result.has_value_,(string *)&event);
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,(Value *)&result.has_value_);
          Value::~Value((Value *)&result.has_value_);
          event_1.value.field_2._12_4_ = 1;
        }
        else if (local_238._0_4_ == YAML_SEQUENCE_START_EVENT) {
          readSequence_abi_cxx11_
                    ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2d0,this);
          bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_2d0);
          if (bVar1) {
            sequence = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_2d0);
            Value::Value((Value *)&result_1.has_value_,sequence);
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,(Value *)&result_1.has_value_);
            Value::~Value((Value *)&result_1.has_value_);
          }
          else {
            pbVar2 = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_2d0);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Unexpected(&local_2f0,pbVar2);
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_2f0);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Unexpected(&local_2f0);
          }
          event_1.value.field_2._12_4_ = 1;
          Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_2d0);
        }
        else if (local_238._0_4_ == YAML_MAPPING_START_EVENT) {
          readMapping_abi_cxx11_
                    ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_398,this);
          bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_398);
          if (bVar1) {
            mapping = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_398);
            Value::Value(&local_428,mapping);
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_428);
            Value::~Value(&local_428);
          }
          else {
            pbVar2 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_398);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Unexpected(&local_3b8,pbVar2);
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_3b8);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Unexpected(&local_3b8);
          }
          event_1.value.field_2._12_4_ = 1;
          Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_398);
        }
        else {
          format_abi_cxx11_(&local_468,"Unexpected event %d",(ulong)(uint)local_238._0_4_);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected(&local_448,&local_468);
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,&local_448);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected(&local_448);
          std::__cxx11::string::~string((string *)&local_468);
          event_1.value.field_2._12_4_ = 1;
        }
        YamlEvent::~YamlEvent((YamlEvent *)local_238);
      }
      else {
        pbVar2 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&event.value.field_2 + 8),"Error while reading mapping: ",pbVar2);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&event.value.field_2 + 8));
        Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_1f0);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_1f0);
        std::__cxx11::string::~string((string *)(event.value.field_2._M_local_buf + 8));
        event_1.value.field_2._12_4_ = 1;
      }
      Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1d0);
      return __return_storage_ptr__;
    }
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_50,this);
    bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_50);
    if (bVar1) {
      pYVar3 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_50);
      YamlEvent::YamlEvent((YamlEvent *)local_d0,pYVar3);
      if (local_d0._0_4_ == YAML_STREAM_START_EVENT) {
        if (event_result_1._44_4_ == 0) {
          event_result_1._44_4_ = 1;
LAB_00199f05:
          event_1.value.field_2._12_4_ = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"Unexpected YAML_STREAM_START_EVENT",&local_111);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected(&local_f0,&local_110);
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,&local_f0);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected(&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator(&local_111);
          event_1.value.field_2._12_4_ = 1;
        }
      }
      else if (local_d0._0_4_ == YAML_DOCUMENT_START_EVENT) {
        if (event_result_1._44_4_ == 1) {
          event_result_1._44_4_ = 2;
          goto LAB_00199f05;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"Unexpected YAML_DOCUMENT_START_EVENT",&local_159);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_138,&local_158);
        Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_138);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
        event_1.value.field_2._12_4_ = 1;
      }
      else {
        format_abi_cxx11_((string *)&event_result.has_value_,"Unexpected event %d",
                          (ulong)(uint)local_d0._0_4_);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &event_result.has_value_);
        Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_180);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_180);
        std::__cxx11::string::~string((string *)&event_result.has_value_);
        event_1.value.field_2._12_4_ = 1;
      }
      YamlEvent::~YamlEvent((YamlEvent *)local_d0);
    }
    else {
      pbVar2 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_50);
      std::operator+(&local_a0,"Error while reading mapping: ",pbVar2);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_80,&local_a0);
      Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_80);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      event_1.value.field_2._12_4_ = 1;
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_50);
    if (event_1.value.field_2._12_4_ != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Expected<Value, std::string> readAnyValue() {
		enum class State {
			Init,
			StreamStarted,
			DocumentStarted,
		};

		for(State state = State::Init; state != State::DocumentStarted;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading mapping: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_STREAM_START_EVENT:
					if (state != State::Init)
						return Unexpected<std::string>("Unexpected YAML_STREAM_START_EVENT");
					state = State::StreamStarted;
					break;
				case YAML_DOCUMENT_START_EVENT:
					if (state != State::StreamStarted)
						return Unexpected<std::string>("Unexpected YAML_DOCUMENT_START_EVENT");
					state = State::DocumentStarted;
					break;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			} // switch (event.type)
		} // for(state != DocumentStarted)

		auto event_result = getNextEvent();
		if (!event_result)
			return Unexpected("Error while reading mapping: " + event_result.error());
		YamlEvent event = std::move(event_result).value();

		switch (event.type) {
			case YAML_SCALAR_EVENT:
				MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
				return Value(std::move(event.value));
			case YAML_SEQUENCE_START_EVENT:
				MSG("YAML_SEQUENCE_START_EVENT");
				{
					auto result = readSequence();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			case YAML_MAPPING_START_EVENT:
				MSG("YAML_MAPPING_START_EVENT");
				{
					auto result = readMapping();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			default:
				return Unexpected(format("Unexpected event %d", event.type));
		}
	}